

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_f16c.cpp
# Opt level: O0

void ncnn::innerproduct_fp16s_pack8_avx_f16c
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_fp16,Mat *bias_data,
               int activation_type,Mat *activation_params,Option *opt)

{
  Option *in_R9;
  Mat *in_stack_000006e0;
  int in_stack_000006ec;
  Mat *in_stack_000006f0;
  Mat *in_stack_000006f8;
  Mat *in_stack_00000700;
  Mat *in_stack_00000708;
  
  innerproduct_fp16s_pack8_avx
            (in_stack_00000708,in_stack_00000700,in_stack_000006f8,in_stack_000006f0,
             in_stack_000006ec,in_stack_000006e0,in_R9);
  return;
}

Assistant:

void innerproduct_fp16s_pack8_avx_f16c(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_fp16, const Mat& bias_data, int activation_type, const Mat& activation_params, const Option& opt)
{
    innerproduct_fp16s_pack8_avx(bottom_blob, top_blob, weight_data_fp16, bias_data, activation_type, activation_params, opt);
}